

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O2

uint64 crnlib::pack_etc1s_block
                 (etc1_block *dst_block,color_quad_u8 *pSrc_pixels,crn_etc1_pack_params *pack_params
                 )

{
  crn_etc_quality cVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  uint8 *puVar7;
  results results;
  params params;
  int scan [9];
  int refine_high [8];
  int refine_medium [4];
  uint8 selectors [16];
  etc1_optimizer optimizer;
  
  etc1_optimizer::etc1_optimizer(&optimizer);
  etc1_optimizer::params::params(&params);
  params.m_num_src_pixels = 0x10;
  params.m_use_color4 = false;
  params.m_constrain_against_base_color5 = false;
  puVar7 = selectors;
  params.m_pSrc_pixels = pSrc_pixels;
  etc1_optimizer::init(&optimizer,(EVP_PKEY_CTX *)&params);
  scan[4] = 0;
  scan[5] = 1;
  scan[6] = 2;
  scan[7] = 3;
  scan[0] = -4;
  scan[1] = -3;
  scan[2] = -2;
  scan[3] = -1;
  scan[8] = 4;
  cVar1 = pack_params->m_quality;
  params.m_scan_delta_size =
       (cVar1 == cCRNETCQualityMedium) + 1 + (uint)(cVar1 == cCRNETCQualityMedium);
  if (cVar1 == cCRNETCQualitySlow) {
    params.m_scan_delta_size = 9;
  }
  params.m_pScan_deltas = (int *)((long)scan + (ulong)(9 - params.m_scan_delta_size) * 2);
  etc1_optimizer::compute(&optimizer);
  if (params.super_crn_etc1_pack_params.m_quality != cCRNETCQualityFast && 6000 < results.m_error) {
    refine_medium[0] = -3;
    refine_medium[1] = -2;
    refine_medium[2] = 2;
    refine_medium[3] = 3;
    refine_high[4] = 5;
    refine_high[5] = 6;
    refine_high[6] = 7;
    refine_high[7] = 8;
    refine_high[0] = -8;
    refine_high[1] = -7;
    refine_high[2] = -6;
    refine_high[3] = -5;
    params.m_scan_delta_size = 2;
    if (12000 < results.m_error) {
      params.m_scan_delta_size = 8;
    }
    params.m_pScan_deltas = (int *)((long)refine_high + (ulong)(8 - params.m_scan_delta_size) * 2);
    if (params.super_crn_etc1_pack_params.m_quality == cCRNETCQualityMedium) {
      params.m_pScan_deltas = refine_medium;
      params.m_scan_delta_size = 4;
    }
    etc1_optimizer::compute(&optimizer);
  }
  bVar3 = 8;
  uVar2 = 0;
  for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
    bVar6 = bVar3;
    for (lVar5 = 0; (int)lVar5 != 4; lVar5 = lVar5 + 1) {
      uVar2 = uVar2 | ((*(byte *)((long)&g_selector_index_to_etc1 + (ulong)puVar7[lVar5]) & 1) <<
                       0x10 | (uint)(*(byte *)((long)&g_selector_index_to_etc1 +
                                              (ulong)puVar7[lVar5]) >> 1)) << (bVar6 & 0xf);
      bVar6 = bVar6 + 4;
    }
    bVar3 = bVar3 + 1;
    puVar7 = puVar7 + 4;
  }
  (dst_block->field_0).m_uint64 =
       (ulong)(results.m_block_inten_table << 0x1a | 0x2000000) |
       CONCAT44(uVar2,results.m_block_inten_table << 0x1d) |
       (ulong)(((uint)results.m_block_color_unscaled.field_0 & 0xbfffff) << 3);
  etc1_optimizer::~etc1_optimizer(&optimizer);
  return results.m_error;
}

Assistant:

uint64 pack_etc1s_block(etc1_block& dst_block, const color_quad_u8* pSrc_pixels, crn_etc1_pack_params& pack_params)
    {
        uint8 selectors[16];
        etc1_optimizer optimizer;
        etc1_optimizer::params params;
        params.m_pSrc_pixels = pSrc_pixels;
        params.m_num_src_pixels = 16;
        params.m_use_color4 = false;
        params.m_constrain_against_base_color5 = false;
        etc1_optimizer::results results;
        results.m_pSelectors = selectors;
        results.m_n = 16;
        optimizer.init(params, results);

        const int scan[] = { -4, -3, -2, -1, 0, 1, 2, 3, 4 };
        params.m_scan_delta_size = pack_params.m_quality == cCRNETCQualitySlow ? CRNLIB_ARRAY_SIZE(scan) : pack_params.m_quality == cCRNETCQualityMedium ? 3
                                                                                                                                                         : 1;
        params.m_pScan_deltas = scan + ((CRNLIB_ARRAY_SIZE(scan) - params.m_scan_delta_size) >> 1);
        optimizer.compute();

        if (params.m_quality >= cCRNETCQualityMedium && results.m_error > 6000)
        {
            const int refine_medium[] = { -3, -2, 2, 3 };
            const int refine_high[] = { -8, -7, -6, -5, 5, 6, 7, 8 };
            if (params.m_quality == cCRNETCQualityMedium)
            {
                params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(refine_medium);
                params.m_pScan_deltas = refine_medium;
            }
            else
            {
                params.m_scan_delta_size = results.m_error > 12000 ? CRNLIB_ARRAY_SIZE(refine_high) : 2;
                params.m_pScan_deltas = refine_high + ((CRNLIB_ARRAY_SIZE(refine_high) - params.m_scan_delta_size) >> 1);
            }
            optimizer.compute();
        }

        uint32 selector = 0;
        for (uint32 i = 0, t = 8, h = 0; h < 4; h++, t -= 15)
        {
            for (uint32 w = 0; w < 4; w++, t += 4, i++)
            {
                uint32 s = g_selector_index_to_etc1[selectors[i]];
                selector |= (s >> 1 | (s & 1) << 16) << (t & 15);
            }
        }

        dst_block.m_uint64 = (uint64)selector << 32 | results.m_block_inten_table << 29 | results.m_block_inten_table << 26 | 1 << 25 | (results.m_block_color_unscaled.m_u32 & 0xFFFFFF) << 3;
        return results.m_error;
    }